

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptNumberObject * __thiscall
Js::JavascriptLibrary::CreateNumberObject(JavascriptLibrary *this,Var number)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptNumberObject *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((this->numberTypeDynamic).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1b85,"(numberTypeDynamic)","Where\'s numberTypeDynamic?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&JavascriptNumberObject::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x1b86;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (JavascriptNumberObject *)new<Memory::Recycler>(0x28,alloc,0x387914);
  JavascriptNumberObject::JavascriptNumberObject(this_00,number,(this->numberTypeDynamic).ptr);
  return this_00;
}

Assistant:

JavascriptNumberObject* JavascriptLibrary::CreateNumberObject(Var number)
    {
        AssertMsg(numberTypeDynamic, "Where's numberTypeDynamic?");
        return RecyclerNew(this->GetRecycler(), JavascriptNumberObject, number, numberTypeDynamic);
    }